

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O3

void set_activeblock(dmr_C *C,entrypoint *ep,basic_block *bb)

{
  byte *pbVar1;
  
  if (ep->active != (basic_block *)0x0) {
    pbVar1 = (byte *)ptrlist_last((ptr_list *)ep->active->insns);
    if ((pbVar1 != (byte *)0x0) && (0xfffffff8 < *pbVar1 - 9)) goto LAB_0012fc44;
  }
  add_goto(C,ep,bb);
LAB_0012fc44:
  ep->active = bb;
  if (bb != (basic_block *)0x0) {
    ptrlist_add((ptr_list **)&ep->bbs,bb,&C->ptrlist_allocator);
    return;
  }
  return;
}

Assistant:

static void set_activeblock(struct dmr_C *C, struct entrypoint *ep, struct basic_block *bb)
{
	if (!dmrC_bb_terminated(ep->active))
		add_goto(C, ep, bb);

	ep->active = bb;
	if (dmrC_bb_reachable(bb))
		dmrC_add_bb(C, &ep->bbs, bb);
}